

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::TokenManager::SetToken
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignedToken,
          bool aAlwaysAccept)

{
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ValidateToken((Error *)local_58,this,aSignedToken,&this->mDomainCAPublicKey);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (__return_storage_ptr__->mCode == kNone) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->mSignedToken,aSignedToken);
    this->mSequenceNumber = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::SetToken(const ByteArray &aSignedToken, bool aAlwaysAccept)
{
    Error error;

    (void)aAlwaysAccept;
    error = ValidateToken(aSignedToken, mDomainCAPublicKey);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    if (aAlwaysAccept)
    {
        if (error != ErrorCode::kNone)
        {
            LOG_WARN(LOG_REGION_TOKEN_MANAGER, "validating token failed: {}", error.ToString());
        }
        SuccessOrExit(error = ERROR_NONE);
    }
    else
#endif
    {
        SuccessOrExit(error);
    }

    mSignedToken    = aSignedToken;
    mSequenceNumber = 0;
exit:
    return error;
}